

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

void __thiscall AActor::UpdateRenderSectorList(AActor *this)

{
  double *pdVar1;
  double dVar2;
  line_t *ld;
  double dVar3;
  int iVar4;
  portnode_t *ppVar5;
  msecnode_t *pmVar6;
  subsector_t *psVar7;
  long lVar8;
  FLinePortal *p;
  sector_t *s;
  FLinePortal *s_00;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  undefined1 local_48 [16];
  double dStack_38;
  double local_30;
  
  dVar2 = (this->__Pos).X;
  if ((dVar2 == (this->OldRenderPos).X) && (!NAN(dVar2) && !NAN((this->OldRenderPos).X))) {
    dVar2 = (this->__Pos).Y;
    pdVar1 = &(this->OldRenderPos).Y;
    if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
      dVar2 = (this->__Pos).Z;
      pdVar1 = &(this->OldRenderPos).Z;
      if ((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) {
        return;
      }
    }
  }
  if (((this->flags).Value & 8) == 0) {
    for (ppVar5 = this->render_portallist; ppVar5 != (portnode_t *)0x0;
        ppVar5 = P_DelPortalnode(ppVar5)) {
    }
    this->render_portallist = (portnode_t *)0x0;
    if (PortalBlockmap.containsLines == true) {
      dVar2 = (this->__Pos).X;
      dVar3 = (this->__Pos).Y;
      if ((((dVar2 != (this->OldRenderPos).X) || (NAN(dVar2) || NAN((this->OldRenderPos).X))) ||
          (pdVar1 = &(this->OldRenderPos).Y, dVar3 != *pdVar1)) || (NAN(dVar3) || NAN(*pdVar1))) {
        uVar11 = (uint)((dVar2 - bmaporgx) * 0.0078125);
        uVar12 = (uint)((dVar3 - bmaporgy) * 0.0078125);
        dVar13 = this->radius * 1.5;
        if (128.0 <= dVar13) {
          dVar13 = 128.0;
        }
        local_48._0_8_ = dVar3 + dVar13;
        local_30 = dVar2 + dVar13;
        unique0x100001d8 = SUB84(dVar2 - dVar13,0);
        local_48._8_8_ = dVar3 - dVar13;
        unique0x100001dc = (int)((ulong)(dVar2 - dVar13) >> 0x20);
        if (((-1 < (int)(uVar12 | uVar11)) && ((int)uVar11 < bmapwidth)) &&
           (((int)uVar12 < bmapheight &&
            ((PortalBlockmap.data.Array[(int)(uVar12 * PortalBlockmap.dx + uVar11)].
              neighborContainsLines == true && ((ulong)linePortals.Count != 0)))))) {
          lVar8 = (ulong)linePortals.Count * 0x48;
          s_00 = linePortals.Array;
          do {
            if (s_00->mType != '\0') {
              ld = s_00->mOrigin;
              if ((((dStack_38 < ld->bbox[3]) &&
                   (ld->bbox[2] <= local_30 && local_30 != ld->bbox[2])) &&
                  (ld->bbox[1] <= (double)local_48._0_8_ && (double)local_48._0_8_ != ld->bbox[1]))
                 && (((double)local_48._8_8_ < ld->bbox[0] &&
                     (iVar4 = FBoundingBox::BoxOnLineSide((FBoundingBox *)local_48,ld), iVar4 != 0))
                    )) {
                ppVar5 = P_AddPortalnode(s_00,this,this->render_portallist);
                this->render_portallist = ppVar5;
              }
            }
            s_00 = s_00 + 1;
            lVar8 = lVar8 + -0x48;
          } while (lVar8 != 0);
        }
      }
    }
    s = this->Sector;
    for (pmVar6 = this->render_sectorlist; pmVar6 != (msecnode_t *)0x0;
        pmVar6 = P_DelSecnode(pmVar6,0x1c0)) {
    }
    this->render_sectorlist = (msecnode_t *)0x0;
    if ((s->planes[1].Flags & 0x1d0U) == 0x100) {
      uVar9 = 0xe0000000;
      uVar10 = 0xc7efffff;
      do {
        uVar11 = s->Portals[1];
        dVar2 = sectorPortals.Array[uVar11].mPlaneZ;
        if ((dVar2 <= (double)CONCAT44(uVar10,uVar9)) ||
           ((this->__Pos).Z + this->Height + 64.0 < dVar2)) break;
        psVar7 = P_PointInSubsector((this->__Pos).X + sectorPortals.Array[uVar11].mDisplacement.X,
                                    (this->__Pos).Y + sectorPortals.Array[uVar11].mDisplacement.Y);
        s = psVar7->sector;
        pmVar6 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
        uVar9 = SUB84(dVar2,0);
        uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
        this->render_sectorlist = pmVar6;
      } while ((s->planes[1].Flags & 0x1d0U) == 0x100);
    }
    if ((s->planes[0].Flags & 0x1d0U) == 0x100) {
      uVar9 = 0xe0000000;
      uVar10 = 0x47efffff;
      do {
        uVar11 = s->Portals[0];
        dVar2 = sectorPortals.Array[uVar11].mPlaneZ;
        if ((double)CONCAT44(uVar10,uVar9) <= dVar2) {
          return;
        }
        if (dVar2 < (this->__Pos).Z + -64.0) {
          return;
        }
        psVar7 = P_PointInSubsector((this->__Pos).X + sectorPortals.Array[uVar11].mDisplacement.X,
                                    (this->__Pos).Y + sectorPortals.Array[uVar11].mDisplacement.Y);
        s = psVar7->sector;
        pmVar6 = P_AddSecnode(s,this,this->render_sectorlist,&s->render_thinglist);
        uVar9 = SUB84(dVar2,0);
        uVar10 = (undefined4)((ulong)dVar2 >> 0x20);
        this->render_sectorlist = pmVar6;
      } while ((s->planes[0].Flags & 0x1d0U) == 0x100);
    }
  }
  return;
}

Assistant:

void AActor::UpdateRenderSectorList()
{
	static const double SPRITE_SPACE = 64.;
	if (Pos() != OldRenderPos && !(flags & MF_NOSECTOR))
	{
		// Only check if the map contains line portals
		ClearRenderLineList();
		if (PortalBlockmap.containsLines && Pos().XY() != OldRenderPos.XY())
		{
			int bx = GetBlockX(X());
			int by = GetBlockY(Y());
			FBoundingBox bb(X(), Y(), MIN(radius*1.5, 128.));	// Don't go further than 128 map units, even for large actors
			// Are there any portals near the actor's position?
			if (bx >= 0 && by >= 0 && bx < bmapwidth && by < bmapheight && PortalBlockmap(bx, by).neighborContainsLines)
			{
				// Go through the entire list. In most cases this is faster than setting up a blockmap iterator
				for (auto &p : linePortals)
				{
					if (p.mType == PORTT_VISUAL) continue;
					if (bb.inRange(p.mOrigin) && bb.BoxOnLineSide(p.mOrigin))
					{
						render_portallist = P_AddPortalnode(&p, this, render_portallist);
					}
				}
			}
		}
		sector_t *sec = Sector;
		double lasth = -FLT_MAX;
		ClearRenderSectorList();
		while (!sec->PortalBlocksMovement(sector_t::ceiling))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::ceiling);
			if (planeh <= lasth) break;	// broken setup.
			if (Top() + SPRITE_SPACE < planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::ceiling);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
		lasth = FLT_MAX;
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			double planeh = sec->GetPortalPlaneZ(sector_t::floor);
			if (planeh >= lasth) break;	// broken setup.
			if (Z() - SPRITE_SPACE > planeh) break;
			lasth = planeh;
			DVector2 newpos = Pos() + sec->GetPortalDisplacement(sector_t::floor);
			sec = P_PointInSector(newpos);
			render_sectorlist = P_AddSecnode(sec, this, render_sectorlist, sec->render_thinglist);
		}
	}
}